

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_unix.c
# Opt level: O3

char * funchook_strerror(int errnum,char *buf,size_t buflen)

{
  char *pcVar1;
  
  pcVar1 = strerror_r(errnum,buf,buflen);
  return pcVar1;
}

Assistant:

const char *funchook_strerror(int errnum, char *buf, size_t buflen)
{
#ifdef GNU_SPECIFIC_STRERROR_R
    /* GNU-specific version */
    return strerror_r(errnum, buf, buflen);
#else
    /* XSI-compliant version */
    if (strerror_r(errnum, buf, buflen) != 0) {
        snprintf(buf, buflen, "errno %d", errnum);
    }
    return buf;
#endif
}